

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringCacheTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleStringInternalCache_clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory_TestShell::
~TEST_SimpleStringInternalCache_clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory_TestShell
          (TEST_SimpleStringInternalCache_clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(SimpleStringInternalCache, clearCacheWillRemoveAllCachedMemoryButNotAllUsedMemory)
{
    cache.setAllocator(allocator);

    char* mem = cache.alloc(10);
    cache.dealloc(mem, 10);

    cache.alloc(60);

    cache.clearCache();

    LONGS_EQUAL(1, accountant.totalDeallocationsOfSize(32));
    LONGS_EQUAL(0, accountant.totalDeallocationsOfSize(64));
}